

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::writeOutfile(QPDFJob *this,QPDF *pdf)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *p;
  char *pcVar5;
  element_type *newname;
  element_type *peVar6;
  element_type *this_00;
  Pipeline *pPVar7;
  size_t in_RCX;
  void *__buf;
  QPDFWriter *w_00;
  QPDFSystemError *e;
  byte local_13a;
  allocator<char> local_139;
  undefined1 local_138 [6];
  bool warnings;
  undefined1 local_118 [8];
  string backup;
  anon_class_8_1_8991fb9c local_e8;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_e0;
  __shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b0 [8];
  QPDFWriter w;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  shared_ptr<char> local_38;
  undefined1 local_28 [8];
  shared_ptr<char> temp_out;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  temp_out.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  std::shared_ptr<char>::shared_ptr((shared_ptr<char> *)local_28);
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->replace_input & 1U) == 0) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar4 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar3->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>)
    ;
    iVar2 = strcmp(peVar4,"-");
    if (iVar2 == 0) {
      std::shared_ptr<char>::shared_ptr
                ((shared_ptr<char> *)
                 &w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(nullptr_t)0x0);
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::shared_ptr<char>::operator=
                (&peVar3->outfilename,
                 (shared_ptr<char> *)
                 &w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<char>::~shared_ptr
                ((shared_ptr<char> *)
                 &w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  else {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar4 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar3->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,peVar4,&local_79);
    std::operator+(&local_58,&local_78,".~qpdf-temp#");
    QUtil::make_shared_cstr((QUtil *)&local_38,&local_58);
    std::shared_ptr<char>::operator=((shared_ptr<char> *)local_28,&local_38);
    std::shared_ptr<char>::~shared_ptr(&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<char>::operator=(&peVar3->outfilename,(shared_ptr<char> *)local_28);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if (peVar3->json_version == 0) {
    QPDFWriter::QPDFWriter
              ((QPDFWriter *)local_b0,
               (QPDF *)temp_out.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar3->outfilename);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar4 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(peVar3->outfilename).
                           super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
      QPDFWriter::setOutputFilename((QPDFWriter *)local_b0,peVar4);
    }
    else {
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar6 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)peVar3);
      QPDFLogger::saveToStandardOutput(peVar6,true);
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar6 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)peVar3);
      QPDFLogger::getSave((QPDFLogger *)&local_c0,SUB81(peVar6,0));
      p = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get(&local_c0);
      QPDFWriter::setOutputPipeline((QPDFWriter *)local_b0,p);
      std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_c0);
    }
    w_00 = (QPDFWriter *)local_b0;
    setWriterOptions(this,w_00);
    QPDFWriter::write((QPDFWriter *)local_b0,(int)w_00,__buf,in_RCX);
    QPDFWriter::~QPDFWriter((QPDFWriter *)local_b0);
  }
  else {
    writeJSON(this,(QPDF *)temp_out.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar3->outfilename);
  if (bVar1) {
    local_e8.this = this;
    std::function<void(Pipeline&,std::__cxx11::string_const&)>::
    function<QPDFJob::writeOutfile(QPDF&)::__0,void>
              ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_e0,&local_e8);
    doIfVerbose(this,&local_e0);
    std::
    function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_e0);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->replace_input & 1U) != 0) {
    std::shared_ptr<char>::shared_ptr
              ((shared_ptr<char> *)((long)&backup.field_2 + 8),(nullptr_t)0x0);
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<char>::operator=
              (&peVar3->outfilename,(shared_ptr<char> *)((long)&backup.field_2 + 8));
    std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)((long)&backup.field_2 + 8));
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->replace_input & 1U) != 0) {
    QPDF::closeInputSource
              ((QPDF *)temp_out.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar4 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar3->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_138,peVar4,&local_139);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   ".~qpdf-orig");
    std::__cxx11::string::~string((string *)local_138);
    std::allocator<char>::~allocator(&local_139);
    local_13a = QPDF::anyWarnings((QPDF *)temp_out.
                                          super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                                          _M_refcount._M_pi);
    if (!(bool)local_13a) {
      std::__cxx11::string::append((ulong)local_118,'\x01');
    }
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar4 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar3->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    QUtil::rename_file(peVar4,pcVar5);
    peVar4 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)local_28);
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    newname = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                        (&(peVar3->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>)
    ;
    QUtil::rename_file(peVar4,newname);
    if ((local_13a & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      QUtil::remove_file(pcVar5);
    }
    else {
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar6 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)peVar3);
      QPDFLogger::getError((QPDFLogger *)&e,SUB81(peVar6,0));
      this_00 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&e);
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      pPVar7 = Pipeline::operator<<(this_00,&peVar3->message_prefix);
      pPVar7 = Pipeline::operator<<(pPVar7,": there are warnings; original file kept in ");
      pPVar7 = Pipeline::operator<<(pPVar7,(string *)local_118);
      Pipeline::operator<<(pPVar7,"\n");
      std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&e);
    }
    std::__cxx11::string::~string((string *)local_118);
  }
  std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)local_28);
  return;
}

Assistant:

void
QPDFJob::writeOutfile(QPDF& pdf)
{
    std::shared_ptr<char> temp_out;
    if (m->replace_input) {
        // Append but don't prepend to the path to generate a temporary name. This saves us from
        // having to split the path by directory and non-directory.
        temp_out = QUtil::make_shared_cstr(std::string(m->infilename.get()) + ".~qpdf-temp#");
        // m->outfilename will be restored to 0 before temp_out goes out of scope.
        m->outfilename = temp_out;
    } else if (strcmp(m->outfilename.get(), "-") == 0) {
        m->outfilename = nullptr;
    }
    if (m->json_version) {
        writeJSON(pdf);
    } else {
        // QPDFWriter must have block scope so the output file will be closed after write()
        // finishes.
        QPDFWriter w(pdf);
        if (m->outfilename) {
            w.setOutputFilename(m->outfilename.get());
        } else {
            // saveToStandardOutput has already been called, but calling it again is defensive and
            // harmless.
            m->log->saveToStandardOutput(true);
            w.setOutputPipeline(m->log->getSave().get());
        }
        setWriterOptions(w);
        w.write();
    }
    if (m->outfilename) {
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": wrote file " << m->outfilename.get() << "\n";
        });
    }
    if (m->replace_input) {
        m->outfilename = nullptr;
    }
    if (m->replace_input) {
        // We must close the input before we can rename files
        pdf.closeInputSource();
        std::string backup = std::string(m->infilename.get()) + ".~qpdf-orig";
        bool warnings = pdf.anyWarnings();
        if (!warnings) {
            backup.append(1, '#');
        }
        QUtil::rename_file(m->infilename.get(), backup.c_str());
        QUtil::rename_file(temp_out.get(), m->infilename.get());
        if (warnings) {
            *m->log->getError() << m->message_prefix
                                << ": there are warnings; original file kept in " << backup << "\n";
        } else {
            try {
                QUtil::remove_file(backup.c_str());
            } catch (QPDFSystemError& e) {
                *m->log->getError() << m->message_prefix << ": unable to delete original file ("
                                    << e.what() << ");" << " original file left in " << backup
                                    << ", but the input was successfully replaced\n";
            }
        }
    }
}